

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O2

TonkResult tonk_send(TonkConnection connection,void *data,uint64_t bytes,uint32_t channel)

{
  TonkResult TVar1;
  Result result;
  
  if (connection == (TonkConnection)0x0) {
    TVar1 = Tonk_InvalidInput;
  }
  else {
    tonk::Connection::tonk_send
              ((Connection *)&result,(uint)connection,(uint8_t *)(ulong)channel,(uint64_t)data);
    TVar1 = TonkResultFromDetailedResult(&result);
    tonk::Result::~Result(&result);
  }
  return TVar1;
}

Assistant:

TONK_EXPORT TonkResult tonk_send(
    TonkConnection      connection, // Connection to send on
    const void*               data, // Pointer to message data
    uint64_t                 bytes, // Message bytes
    uint32_t               channel  // Channel to attach to message
)
{
    Connection* tonkConnection = reinterpret_cast<Connection*>(connection);
    if (!tonkConnection)
    {
        TONK_DEBUG_BREAK(); // Invalid input
        return Tonk_InvalidInput;
    }

    Result result = tonkConnection->tonk_send(
        channel,
        reinterpret_cast<const uint8_t*>(data),
        bytes);
    return TonkResultFromDetailedResult(result);
}